

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_point.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double *ptr;
  uint uVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing PhyRay Point3f...",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  ptr = (double *)phyr::allocAligned(0x18);
  *ptr = 5.0;
  ptr[1] = 6.0;
  ptr[2] = 7.0;
  std::ostream::_M_insert<bool>(true);
  uVar1 = 1;
  if ((((*ptr == 5.0) && (!NAN(*ptr))) && (ptr[1] == 6.0)) && (!NAN(ptr[1]))) {
    uVar1 = -(uint)(ptr[2] != 7.0) & 1;
  }
  phyr::freeAligned(ptr);
  return uVar1;
}

Assistant:

int main(int argc, const char* argv[]) {
    std::cout << "Testing PhyRay Point3f..." << std::endl;

    Point3f* p1 = allocAligned<Point3f>(1);
    Point3f p2(5, 6, 7);
    p1->x = 1; p1->y = 2; p1->z = 3;

    *p1 = p2;

    ASSERT(!p1->hasNaNs());

    bool a = p1->hasNaNs();
    std::cout << a;

    bool valid = *p1 == p2;

    freeAligned(p1);

    return valid ? 0 : 1;
}